

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O0

void * __thiscall ncnn::PoolAllocator::fastMalloc(PoolAllocator *this,size_t size)

{
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  pointer ppVar7;
  ulong in_RSI;
  long in_RDI;
  void *ptr;
  void *ptr_1;
  size_t bs;
  iterator it_min;
  iterator it_max;
  iterator it;
  void *ptr_2;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_fffffffffffffef8;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff00;
  const_iterator in_stack_ffffffffffffff08;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *in_stack_ffffffffffffff10;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_a0;
  _List_node_base *local_98;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_90;
  pair<unsigned_long,_void_*> local_88;
  _List_node_base *local_78;
  _List_const_iterator<std::pair<unsigned_long,_void_*>_> local_70;
  void *local_68;
  ulong local_60;
  _Self local_58;
  iterator local_50;
  iterator local_48;
  _Self local_40;
  ulong local_38;
  void *local_20;
  void *local_18;
  void *local_10;
  ulong local_8;
  
  local_38 = in_RSI;
  Mutex::lock((Mutex *)0x170e5d);
  local_40._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_fffffffffffffef8);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_fffffffffffffef8);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
       begin(in_stack_fffffffffffffef8);
  while( true ) {
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
         ::end(in_stack_fffffffffffffef8);
    bVar4 = std::operator!=(&local_40,&local_58);
    if (!bVar4) {
      sVar6 = std::__cxx11::
              list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              ::size(in_stack_ffffffffffffff00);
      if (*(ulong *)(*(long *)(in_RDI + 8) + 0x58) <= sVar6) {
        ppVar7 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                           ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1710e5);
        if (ppVar7->first < local_38) {
          ppVar7 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                             ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x1710ff);
          local_18 = ppVar7->second;
          if (local_18 != (void *)0x0) {
            free(local_18);
          }
          in_stack_ffffffffffffff10 =
               (list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                *)(*(long *)(in_RDI + 8) + 0x60);
          std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
                    (&local_90,&local_50);
          local_98 = (_List_node_base *)
                     std::__cxx11::
                     list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                     ::erase(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
        }
        else {
          ppVar7 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                             ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x17116d);
          if (local_38 < ppVar7->first) {
            ppVar7 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                               ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x171187);
            local_20 = ppVar7->second;
            if (local_20 != (void *)0x0) {
              free(local_20);
            }
            in_stack_ffffffffffffff08._M_node = (_List_node_base *)(*(long *)(in_RDI + 8) + 0x60);
            std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
                      (&local_a0,&local_48);
            std::__cxx11::
            list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ::erase(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
          }
        }
      }
      Mutex::unlock((Mutex *)0x1711f5);
      local_8 = local_38;
      local_10 = (void *)0x0;
      iVar5 = posix_memalign(&local_10,0x40,local_38 + 0x40);
      if (iVar5 != 0) {
        local_10 = (void *)0x0;
      }
      pvVar3 = local_10;
      Mutex::lock((Mutex *)0x17125f);
      std::make_pair<unsigned_long&,void*&>
                ((unsigned_long *)(*(long *)(in_RDI + 8) + 0x78),(void **)in_stack_fffffffffffffef8)
      ;
      std::__cxx11::
      list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
      push_back(in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08._M_node);
      Mutex::unlock((Mutex *)0x1712ae);
      return pvVar3;
    }
    ppVar7 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x170ef6);
    uVar1 = ppVar7->first;
    local_60 = uVar1;
    if ((local_38 <= uVar1) && (uVar1 * *(uint *)(*(long *)(in_RDI + 8) + 0x50) >> 8 <= local_38))
    break;
    ppVar7 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x17104b);
    uVar2 = local_60;
    if (uVar1 < ppVar7->first) {
      local_50._M_node = local_40._M_node;
    }
    ppVar7 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                       ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x171082);
    if (ppVar7->first < uVar2) {
      local_48._M_node = local_40._M_node;
    }
    std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator++(&local_40);
  }
  ppVar7 = std::_List_iterator<std::pair<unsigned_long,_void_*>_>::operator->
                     ((_List_iterator<std::pair<unsigned_long,_void_*>_> *)0x170f4e);
  local_68 = ppVar7->second;
  std::_List_const_iterator<std::pair<unsigned_long,_void_*>_>::_List_const_iterator
            (&local_70,&local_40);
  local_78 = (_List_node_base *)
             std::__cxx11::
             list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
             ::erase(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08);
  Mutex::unlock((Mutex *)0x170faf);
  Mutex::lock((Mutex *)0x170fc1);
  local_88 = std::make_pair<unsigned_long&,void*&>
                       ((unsigned_long *)in_stack_ffffffffffffff00,
                        (void **)in_stack_fffffffffffffef8);
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08._M_node);
  Mutex::unlock((Mutex *)0x17101c);
  return local_68;
}

Assistant:

void* PoolAllocator::fastMalloc(size_t size)
{
    d->budgets_lock.lock();

    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin(), it_max = d->budgets.begin(), it_min = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->budgets_lock.unlock();

            d->payouts_lock.lock();

            d->payouts.push_back(std::make_pair(bs, ptr));

            d->payouts_lock.unlock();

            return ptr;
        }

        if (bs < it_min->first)
        {
            it_min = it;
        }
        if (bs > it_max->first)
        {
            it_max = it;
        }
    }

    if (d->budgets.size() >= d->size_drop_threshold)
    {
        // All chunks in pool are not chosen. Then try to drop some outdated
        // chunks and return them to OS.
        if (it_max->first < size)
        {
            // Current query is asking for a chunk larger than any cached chunks.
            // Then remove the smallest one.
            ncnn::fastFree(it_min->second);
            d->budgets.erase(it_min);
        }
        else if (it_min->first > size)
        {
            // Current query is asking for a chunk smaller than any cached chunks.
            // Then remove the largest one.
            ncnn::fastFree(it_max->second);
            d->budgets.erase(it_max);
        }
    }

    d->budgets_lock.unlock();

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts_lock.lock();

    d->payouts.push_back(std::make_pair(size, ptr));

    d->payouts_lock.unlock();

    return ptr;
}